

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

xmlChar * htmlParseHTMLName_nonInvasive(htmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  long lVar3;
  byte bVar4;
  xmlChar loc [100];
  byte local_68 [104];
  
  pxVar1 = ctxt->input;
  bVar4 = pxVar1->cur[1];
  if ((((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a) || (bVar4 == 0x5f)) || (bVar4 == 0x3a)) {
    lVar3 = 0;
    do {
      bVar4 = pxVar1->cur[lVar3 + 1];
      if ((byte)(bVar4 + 0xbf) < 0x1a) {
LAB_001517fe:
        bVar4 = bVar4 + 0x20;
      }
      else {
        if ((9 < (byte)(bVar4 - 0x30) && 0x19 < (byte)(bVar4 + 0x9f)) &&
           ((0x32 < bVar4 - 0x2d || ((0x4000000002001U >> ((ulong)(bVar4 - 0x2d) & 0x3f) & 1) == 0))
           )) goto LAB_00151814;
        if ((byte)(bVar4 + 0xbf) < 0x1a) goto LAB_001517fe;
      }
      local_68[lVar3] = bVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 100);
    lVar3 = 100;
LAB_00151814:
    pxVar2 = xmlDictLookup(ctxt->dict,local_68,(int)lVar3);
  }
  else {
    pxVar2 = (xmlChar *)0x0;
  }
  return pxVar2;
}

Assistant:

static const xmlChar *
htmlParseHTMLName_nonInvasive(htmlParserCtxtPtr ctxt) {
    int i = 0;
    xmlChar loc[HTML_PARSER_BUFFER_SIZE];

    if (!IS_ASCII_LETTER(NXT(1)) && (NXT(1) != '_') &&
        (NXT(1) != ':')) return(NULL);

    while ((i < HTML_PARSER_BUFFER_SIZE) &&
           ((IS_ASCII_LETTER(NXT(1+i))) || (IS_ASCII_DIGIT(NXT(1+i))) ||
	   (NXT(1+i) == ':') || (NXT(1+i) == '-') || (NXT(1+i) == '_'))) {
	if ((NXT(1+i) >= 'A') && (NXT(1+i) <= 'Z')) loc[i] = NXT(1+i) + 0x20;
        else loc[i] = NXT(1+i);
	i++;
    }

    return(xmlDictLookup(ctxt->dict, loc, i));
}